

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

int anon_unknown.dwarf_187aae::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int local_3c;
  
  uVar2 = (ulong)(int)(anonymous_namespace)::MyItem::s_current_sort_specs[1];
  bVar5 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    pcVar3 = (char *)(*(anonymous_namespace)::MyItem::s_current_sort_specs + 8);
    uVar4 = 1;
    do {
      switch(*(undefined4 *)(pcVar3 + -8)) {
      case 0:
        iVar1 = *lhs - *rhs;
        break;
      case 1:
      case 4:
        iVar1 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                      ,0xde0,
                      "static int (anonymous namespace)::MyItem::CompareWithSortSpecs(const void *, const void *)"
                     );
      case 3:
        iVar1 = *(int *)((long)lhs + 0x10) - *(int *)((long)rhs + 0x10);
      }
      if (iVar1 < 1) {
        bVar6 = true;
        if (iVar1 < 0) {
          bVar6 = *pcVar3 != '\x01';
          goto LAB_00202454;
        }
      }
      else {
        bVar6 = *pcVar3 == '\x01';
LAB_00202454:
        local_3c = (uint)bVar6 * 2 + -1;
        bVar6 = false;
      }
      if (!bVar6) break;
      bVar5 = uVar4 < uVar2;
      pcVar3 = pcVar3 + 0xc;
      bVar6 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  if (!bVar5) {
    local_3c = *lhs - *rhs;
  }
  return local_3c;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }